

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_sender.cc
# Opt level: O1

bool __thiscall quic::Bbr2Sender::IsPipeSufficientlyFull(Bbr2Sender *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  if (this->mode_ == STARTUP) {
    lVar1 = (this->model_).max_bandwidth_filter_.max_bandwidth_[0].bits_per_second_;
    lVar3 = (this->model_).max_bandwidth_filter_.max_bandwidth_[1].bits_per_second_;
    if (lVar3 < lVar1) {
      lVar3 = lVar1;
    }
    lVar1 = (this->model_).bandwidth_lo_.bits_per_second_;
    if (lVar1 < lVar3) {
      lVar3 = lVar1;
    }
    lVar3 = lVar3 * (this->model_).min_rtt_filter_.min_rtt_.time_offset_;
    lVar1 = lVar3 + 7;
    if (-1 < lVar3) {
      lVar1 = lVar3;
    }
    fVar5 = (float)((ulong)(lVar1 >> 3) / 1000000) * 1.5;
    uVar4 = (ulong)fVar5;
    uVar4 = (long)(fVar5 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4;
    uVar2 = (this->params_).cwnd_limits.min_;
  }
  else {
    fVar5 = (this->model_).pacing_gain_;
    lVar1 = (this->model_).max_bandwidth_filter_.max_bandwidth_[0].bits_per_second_;
    lVar3 = (this->model_).max_bandwidth_filter_.max_bandwidth_[1].bits_per_second_;
    if (lVar3 < lVar1) {
      lVar3 = lVar1;
    }
    lVar1 = (this->model_).bandwidth_lo_.bits_per_second_;
    if (lVar1 < lVar3) {
      lVar3 = lVar1;
    }
    lVar3 = lVar3 * (this->model_).min_rtt_filter_.min_rtt_.time_offset_;
    lVar1 = lVar3 + 7;
    if (-1 < lVar3) {
      lVar1 = lVar3;
    }
    fVar6 = (float)((ulong)(lVar1 >> 3) / 1000000);
    uVar2 = (this->params_).cwnd_limits.min_;
    if (fVar5 <= 1.0) {
      fVar5 = fVar6 * 1.1;
    }
    else {
      fVar5 = fVar5 * fVar6;
    }
    uVar4 = (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
  }
  if (uVar4 < uVar2) {
    uVar4 = uVar2;
  }
  return uVar4 <= this->unacked_packets_->_bytes_in_flight;
}

Assistant:

bool Bbr2Sender::IsPipeSufficientlyFull() const {
	QuicByteCount bytes_in_flight = unacked_packets_->bytes_in_flight();
  // See if we need more bytes in flight to see more bandwidth.
  if (mode_ == Bbr2Mode::STARTUP) {
    // STARTUP exits if it doesn't observe a 25% bandwidth increase, so the CWND
    // must be more than 25% above the target.
    return bytes_in_flight >= GetTargetCongestionWindow(1.5);
  }
  if (model_.pacing_gain() > 1) {
    // Super-unity PROBE_BW doesn't exit until 1.25 * BDP is achieved.
    return bytes_in_flight >= GetTargetCongestionWindow(model_.pacing_gain());
  }
  // If bytes_in_flight are above the target congestion window, it should be
  // possible to observe the same or more bandwidth if it's available.
  return bytes_in_flight >= GetTargetCongestionWindow(1.1);
}